

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void __thiscall lsh::vector::vector(vector *this,vector<bool,_std::allocator<bool>_> *cs)

{
  uint uVar1;
  iterator __position;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->components_;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (cs->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  iVar2 = *(int *)&(cs->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                   ._M_finish.super__Bit_iterator_base._M_p -
          *(int *)&(cs->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                   ._M_start.super__Bit_iterator_base._M_p;
  uVar1 = uVar4 + iVar2 * 8;
  this->size_ = uVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
             (ulong)(uVar4 + iVar2 * 8 + 0x1f >> 5));
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      uVar5 = uVar4 + 0x20;
      uVar3 = uVar1 - uVar4;
      if (uVar5 <= uVar1) {
        uVar3 = 0x20;
      }
      local_3c = 0;
      if (uVar3 != 0) {
        if (uVar1 < uVar5) {
          uVar5 = uVar1;
        }
        iVar2 = ~uVar4 + uVar5;
        uVar5 = 0;
        local_3c = 0;
        do {
          local_3c = local_3c |
                     (uint)(((cs->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             [uVar4 + uVar5 >> 6] >> ((ulong)(uVar4 + uVar5) & 0x3f) & 1) != 0) <<
                     ((byte)iVar2 & 0x1f);
          uVar5 = uVar5 + 1;
          iVar2 = iVar2 + -1;
        } while (uVar5 < uVar3);
      }
      __position._M_current =
           (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_38,__position,&local_3c);
      }
      else {
        *__position._M_current = local_3c;
        (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar4 = uVar3 + uVar4;
    } while (uVar4 < uVar1);
  }
  if ((this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true>::
    _S_do_it((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  }
  return;
}

Assistant:

vector::vector(const std::vector<bool>& cs) {
    this->size_ = cs.size();

    unsigned int s = this->size_;
    unsigned int c = this->chunk_size_;
    unsigned int i = 0;
    unsigned int n = (s + c - 1) / c;

    this->components_.reserve(n);

    while (i < s) {
      // Compute the number of bits in the current chunk.
      unsigned int b = i + c > s ? s - i : c;

      unsigned int e = 0;

      for (unsigned int j = 0; j < b; j++) {
        e |= cs[i + j] << (b - j - 1);
      }

      this->components_.push_back(e);

      i += b;
    }

    this->components_.shrink_to_fit();
  }